

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.c
# Opt level: O0

int main(void)

{
  gdImagePtr pgVar1;
  gdImagePtr pgVar2;
  gdImagePtr im2;
  gdImagePtr im;
  
  pgVar1 = (gdImagePtr)gdImageCreateTrueColor(400);
  if (pgVar1 == (gdImagePtr)0x0) {
    fprintf(_stderr,"Can\'t create 400x400 TC image\n");
    im._4_4_ = 1;
  }
  else {
    gdImageFilledRectangle(pgVar1,0x13,0x1d,0x186,0x186,0xffffff);
    gdImageRectangle(pgVar1,0x13,0x1d,0x186,0x186,0xff0000);
    save_png(pgVar1,"a1.png");
    pgVar2 = (gdImagePtr)gdImageCropAuto(pgVar1,4);
    if (pgVar2 != (gdImagePtr)0x0) {
      save_png(pgVar2,"a2.png");
      gdImageDestroy(pgVar2);
    }
    gdImageDestroy(pgVar1);
    pgVar1 = read_png("test_crop_threshold.png");
    if (pgVar1 == (gdImagePtr)0x0) {
      im._4_4_ = 1;
    }
    else {
      pgVar2 = (gdImagePtr)gdImageCropThreshold(0x3f19999a,pgVar1,0xffffff);
      if (pgVar2 != (gdImagePtr)0x0) {
        save_png(pgVar2,"a4.png");
        gdImageDestroy(pgVar2);
      }
      gdImageDestroy(pgVar1);
      im._4_4_ = 0;
    }
  }
  return im._4_4_;
}

Assistant:

int main()
{
	gdImagePtr im, im2;

	im = gdImageCreateTrueColor(400, 400);

	if (!im) {
		fprintf(stderr, "Can't create 400x400 TC image\n");
		return 1;
	}

	gdImageFilledRectangle(im, 19, 29, 390, 390, 0xFFFFFF);
	gdImageRectangle(im, 19, 29, 390, 390, 0xFF0000);
	save_png(im, "a1.png");

	im2 = gdImageCropAuto(im, GD_CROP_SIDES);
	if (im2) {
		save_png(im2, "a2.png");
		gdImageDestroy(im2);
	}
	gdImageDestroy(im);

	im = read_png("test_crop_threshold.png");
	if (!im) {
		return 1;
	}

	im2 = gdImageCropThreshold(im, 0xFFFFFF, 0.6);
	if (im2) {
		save_png(im2, "a4.png");
		gdImageDestroy(im2);
	}

	gdImageDestroy(im);
	return 0;
}